

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void tchecker::clockbounds::compute_clockbounds(system_t *system,clockbounds_t *clockbounds)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *this;
  clockbounds_t *this_00;
  bool bVar4;
  df_solver_t *this_01;
  const_iterator cVar5;
  typed_expression_t *ptVar6;
  const_iterator cVar7;
  typed_statement_t *stmt;
  runtime_error *this_02;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar8;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar9;
  shared_ptr<tchecker::clockbounds::df_solver_t> solver;
  local_lu_map_t *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  local_lu_map_t *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<tchecker::clockbounds::df_solver_t> local_48;
  clockbounds_t *local_38;
  
  this_01 = (df_solver_t *)operator_new(0x40);
  df_solver_t::df_solver_t(this_01,system);
  local_48.super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::clockbounds::df_solver_t*>
            (&local_48.
              super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  rVar8 = tchecker::system::locs_t::locations(&(system->super_system_t).super_system_t.super_locs_t)
  ;
  cVar5._M_current =
       (shared_ptr<tchecker::system::loc_t> *)rVar8._begin.super_const_iterator._M_current;
  local_38 = clockbounds;
  if ((const_iterator)cVar5._M_current !=
      rVar8._end.super_const_iterator._M_current.super_const_iterator) {
    do {
      peVar1 = ((cVar5._M_current)->
               super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var2 = ((cVar5._M_current)->
               super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      ptVar6 = ta::system_t::invariant(system,peVar1->_id);
      add_location_constraints(ptVar6,peVar1->_id,&local_48);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      cVar5._M_current = cVar5._M_current + 1;
    } while ((const_iterator)cVar5._M_current !=
             rVar8._end.super_const_iterator._M_current.super_const_iterator);
  }
  rVar9 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  for (cVar7._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar9._begin.super_const_iterator._M_current;
      this_00 = local_38,
      this = local_48.
             super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,
      (const_iterator)cVar7._M_current !=
      rVar9._end.super_const_iterator._M_current.super_const_iterator;
      cVar7._M_current = cVar7._M_current + 1) {
    peVar3 = ((cVar7._M_current)->
             super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = ((cVar7._M_current)->
             super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    ptVar6 = ta::system_t::guard(system,peVar3->_id);
    stmt = ta::system_t::statement(system,peVar3->_id);
    add_edge_constraints(ptVar6,stmt,peVar3->_src,peVar3->_tgt,&local_48);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  clockbounds_t::local_lu_map(local_38);
  bVar4 = df_solver_t::solve(this,local_68);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (bVar4) {
    clockbounds_t::global_lu_map(this_00);
    clockbounds_t::local_lu_map(this_00);
    fill_global_lu_map((global_lu_map_t *)local_68,local_58);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    clockbounds_t::local_m_map(this_00);
    clockbounds_t::local_lu_map(this_00);
    fill_local_m_map((local_m_map_t *)local_68,local_58);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    clockbounds_t::global_m_map(this_00);
    clockbounds_t::local_lu_map(this_00);
    fill_global_m_map((global_m_map_t *)local_68,local_58);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    if (local_48.super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"compute_clockbounds: clock bounds cannot be computed");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compute_clockbounds(tchecker::ta::system_t const & system, tchecker::clockbounds::clockbounds_t & clockbounds)
{
  std::shared_ptr<tchecker::clockbounds::df_solver_t> solver{new tchecker::clockbounds::df_solver_t{system}};

  for (tchecker::system::loc_const_shared_ptr_t const & loc : system.locations())
    tchecker::clockbounds::add_location_constraints(system.invariant(loc->id()), loc->id(), solver);

  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges())
    tchecker::clockbounds::add_edge_constraints(system.guard(edge->id()), system.statement(edge->id()), edge->src(),
                                                edge->tgt(), solver);

  bool const has_solution = solver->solve(*clockbounds.local_lu_map());
  if (!has_solution)
    throw std::runtime_error("compute_clockbounds: clock bounds cannot be computed");

  tchecker::clockbounds::fill_global_lu_map(*clockbounds.global_lu_map(), *clockbounds.local_lu_map());
  tchecker::clockbounds::fill_local_m_map(*clockbounds.local_m_map(), *clockbounds.local_lu_map());
  tchecker::clockbounds::fill_global_m_map(*clockbounds.global_m_map(), *clockbounds.local_lu_map());
}